

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O2

int __thiscall Centaurus::ATNMachine<char>::add_node(ATNMachine<char> *this,int from,int priority)

{
  pointer pAVar1;
  
  pAVar1 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ATNNode<char>::add_transition
            (pAVar1 + from,
             (int)(((long)(this->m_nodes).
                          super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x98),
             priority);
  std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::emplace_back<>
            (&this->m_nodes);
  return (int)(((long)(this->m_nodes).
                      super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_nodes).
                     super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x98) + -1;
}

Assistant:

int add_node(int from, int priority = 0)
    {
        m_nodes[from].add_transition(m_nodes.size(), priority);
        m_nodes.emplace_back();
        return m_nodes.size() - 1;
    }